

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O2

void Qentem::Test::TestCopyValue1(QTest *test)

{
  Value<char> *pVVar1;
  ValueC *pVVar2;
  SizeT32 i;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  ValueC value1;
  VString key;
  ObjectItem *h_arr_storage;
  ValueC *arr_storage;
  char *c_str_var;
  VHArray h_arr_var;
  VArray arr_var;
  VString str_var;
  
  value1.type_ = Undefined;
  str_var.storage_ = (char *)0x0;
  str_var.length_ = 0;
  value1.field_0.array_.storage_ = (Value<char> *)0x0;
  value1.field_0._8_8_ = 0;
  arr_var.storage_ = (Value<char> *)0x0;
  arr_var.index_ = 0;
  arr_var.capacity_ = 0;
  h_arr_var.
  super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  .hashTable_ = (SizeT *)0x0;
  h_arr_var.
  super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  .index_ = 0;
  h_arr_var.
  super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  .capacity_ = 0;
  Value<char>::reset(&value1);
  value1.type_ = True;
  String<char>::String(&key,"-ABCDEF0123456789ABCDEF0123456789-");
  String<char>::operator=(&str_var,&key);
  Memory::Deallocate(key.storage_);
  c_str_var = str_var.storage_;
  Value<char>::operator=(&value1,&str_var);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != String) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == String;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0x8cf);
  key.storage_ = Value<char>::StringStorage(&value1);
  QTest::IsNotEqual<char_const*,char_const*>(test,&key.storage_,&c_str_var,0x8d0);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = True;
  Array<Qentem::Value<char>_>::Array((Array<Qentem::Value<char>_> *)&key,1,false);
  Array<Qentem::Value<char>_>::operator=(&arr_var,(Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&key);
  Value<char>::operator=(&value1,&arr_var);
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0x8d9);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x8da);
  QTest::IsNull(test,(void *)value1.field_0.number_,0x8db);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = True;
  key.storage_ = (char *)0x0;
  key.length_ = 0;
  key._12_4_ = 0;
  Array<Qentem::Value<char>_>::operator=(&arr_var,(Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::ResizeAndInitialize(&arr_var,3);
  arr_storage = arr_var.storage_;
  Value<char>::operator=(&value1,&arr_var);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0x8e4);
  uVar3 = 0;
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x8e5);
  QTest::IsNotNull(test,(void *)value1.field_0.number_,0x8e6);
  key.storage_ = value1.field_0.string_.storage_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,(Value<char> **)&key,&arr_storage,0x8e7);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = True;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&key,1);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&h_arr_var.
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ,(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  Value<char>::operator=
            (&value1,(ObjectT *)
                     &h_arr_var.
                      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            );
  if (value1.type_ != Object) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == Object;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0x8f0);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x8f1);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNull(test,(void *)((long)&(value1.field_0.array_.storage_)->field_0 +
                             (ulong)*(uint *)((long)pVVar2 + 0xc) * 4),0x8f2);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = True;
  key.storage_ = (char *)0x0;
  key.length_ = 0;
  key._12_4_ = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&h_arr_var.
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ,(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  for (; uVar3 != 3; uVar3 = uVar3 + 1) {
    key.storage_ = (char *)0x0;
    key._8_8_ = key._8_8_ & 0xffffffff00000000;
    Digit::NumberToString<false,Qentem::String<char>,unsigned_int>
              ((String<char> *)&key,uVar3,(RealFormatInfo)0x6);
    pVVar1 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator[]
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)
                        &h_arr_var.
                         super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                        ,(String<char> *)&key);
    Value<char>::operator=(pVVar1,uVar3);
    Memory::Deallocate(key.storage_);
  }
  h_arr_storage =
       (ObjectItem *)
       (h_arr_var.
        super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
        .hashTable_ +
       ((ulong)h_arr_var.
               super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               ._8_8_ >> 0x20));
  Value<char>::operator=(&value1,&h_arr_var);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Object) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Object;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0x902);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x903);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,(void *)((long)&(value1.field_0.array_.storage_)->field_0 +
                                (ulong)*(uint *)((long)pVVar2 + 0xc) * 4),0x904);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  key.storage_ = (char *)((long)&(value1.field_0.array_.storage_)->field_0 +
                         (ulong)*(uint *)((long)pVVar2 + 0xc) * 4);
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (test,(HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> **)&key,&h_arr_storage,0x905
            );
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = False;
  String<char>::String(&key,"-ABCDEF0123456789ABCDEF0123456789-");
  String<char>::operator=(&str_var,&key);
  Memory::Deallocate(key.storage_);
  c_str_var = str_var.storage_;
  Value<char>::operator=(&value1,&str_var);
  if (value1.type_ != String) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == String;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0x90f);
  key.storage_ = Value<char>::StringStorage(&value1);
  QTest::IsNotEqual<char_const*,char_const*>(test,&key.storage_,&c_str_var,0x910);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = False;
  Array<Qentem::Value<char>_>::Array((Array<Qentem::Value<char>_> *)&key,1,false);
  Array<Qentem::Value<char>_>::operator=(&arr_var,(Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&key);
  Value<char>::operator=(&value1,&arr_var);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0x919);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x91a);
  QTest::IsNull(test,(void *)value1.field_0.number_,0x91b);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = False;
  key.storage_ = (char *)0x0;
  key.length_ = 0;
  key._12_4_ = 0;
  Array<Qentem::Value<char>_>::operator=(&arr_var,(Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::ResizeAndInitialize(&arr_var,3);
  arr_storage = arr_var.storage_;
  Value<char>::operator=(&value1,&arr_var);
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0x924);
  uVar3 = 0;
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x925);
  QTest::IsNotNull(test,(void *)value1.field_0.number_,0x926);
  key.storage_ = value1.field_0.string_.storage_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,(Value<char> **)&key,&arr_storage,0x927);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = False;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&key,1);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&h_arr_var.
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ,(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  Value<char>::operator=
            (&value1,(ObjectT *)
                     &h_arr_var.
                      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            );
  if (value1.type_ == Object) {
    bVar4 = true;
  }
  else if (value1.type_ == ValuePtr) {
    bVar4 = (value1.field_0.array_.storage_)->type_ == Object;
  }
  else {
    bVar4 = false;
  }
  QTest::IsTrue(test,bVar4,0x930);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x931);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNull(test,(void *)((long)&(value1.field_0.array_.storage_)->field_0 +
                             (ulong)*(uint *)((long)pVVar2 + 0xc) * 4),0x932);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = False;
  key.storage_ = (char *)0x0;
  key.length_ = 0;
  key._12_4_ = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&h_arr_var.
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ,(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  for (; uVar3 != 3; uVar3 = uVar3 + 1) {
    key.storage_ = (char *)0x0;
    key._8_8_ = key._8_8_ & 0xffffffff00000000;
    Digit::NumberToString<false,Qentem::String<char>,unsigned_int>
              ((String<char> *)&key,uVar3,(RealFormatInfo)0x6);
    pVVar1 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator[]
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)
                        &h_arr_var.
                         super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                        ,(String<char> *)&key);
    Value<char>::operator=(pVVar1,uVar3);
    Memory::Deallocate(key.storage_);
  }
  h_arr_storage =
       (ObjectItem *)
       (h_arr_var.
        super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
        .hashTable_ +
       ((ulong)h_arr_var.
               super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               ._8_8_ >> 0x20));
  Value<char>::operator=(&value1,&h_arr_var);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Object) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Object;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0x942);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x943);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,(void *)((long)&(value1.field_0.array_.storage_)->field_0 +
                                (ulong)*(uint *)((long)pVVar2 + 0xc) * 4),0x944);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  key.storage_ = (char *)((long)&(value1.field_0.array_.storage_)->field_0 +
                         (ulong)*(uint *)((long)pVVar2 + 0xc) * 4);
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (test,(HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> **)&key,&h_arr_storage,0x945
            );
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = Null;
  String<char>::String(&key,"-ABCDEF0123456789ABCDEF0123456789-");
  String<char>::operator=(&str_var,&key);
  Memory::Deallocate(key.storage_);
  c_str_var = str_var.storage_;
  Value<char>::operator=(&value1,&str_var);
  if (value1.type_ != String) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == String;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0x94f);
  key.storage_ = Value<char>::StringStorage(&value1);
  QTest::IsNotEqual<char_const*,char_const*>(test,&key.storage_,&c_str_var,0x950);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = Null;
  Array<Qentem::Value<char>_>::Array((Array<Qentem::Value<char>_> *)&key,1,false);
  Array<Qentem::Value<char>_>::operator=(&arr_var,(Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&key);
  Value<char>::operator=(&value1,&arr_var);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0x959);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x95a);
  QTest::IsNull(test,(void *)value1.field_0.number_,0x95b);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = Null;
  key.storage_ = (char *)0x0;
  key.length_ = 0;
  key._12_4_ = 0;
  Array<Qentem::Value<char>_>::operator=(&arr_var,(Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::ResizeAndInitialize(&arr_var,3);
  arr_storage = arr_var.storage_;
  Value<char>::operator=(&value1,&arr_var);
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0x964);
  uVar3 = 0;
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x965);
  QTest::IsNotNull(test,(void *)value1.field_0.number_,0x966);
  key.storage_ = value1.field_0.string_.storage_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,(Value<char> **)&key,&arr_storage,0x967);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = Null;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&key,1);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&h_arr_var.
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ,(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  Value<char>::operator=
            (&value1,(ObjectT *)
                     &h_arr_var.
                      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            );
  if (value1.type_ == Object) {
    bVar4 = true;
  }
  else if (value1.type_ == ValuePtr) {
    bVar4 = (value1.field_0.array_.storage_)->type_ == Object;
  }
  else {
    bVar4 = false;
  }
  QTest::IsTrue(test,bVar4,0x970);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x971);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNull(test,(void *)((long)&(value1.field_0.array_.storage_)->field_0 +
                             (ulong)*(uint *)((long)pVVar2 + 0xc) * 4),0x972);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value1);
  value1.type_ = Null;
  key.storage_ = (char *)0x0;
  key.length_ = 0;
  key._12_4_ = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&h_arr_var.
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ,(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  for (; uVar3 != 3; uVar3 = uVar3 + 1) {
    key.storage_ = (char *)0x0;
    key._8_8_ = key._8_8_ & 0xffffffff00000000;
    Digit::NumberToString<false,Qentem::String<char>,unsigned_int>
              ((String<char> *)&key,uVar3,(RealFormatInfo)0x6);
    pVVar1 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator[]
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)
                        &h_arr_var.
                         super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                        ,(String<char> *)&key);
    Value<char>::operator=(pVVar1,uVar3);
    Memory::Deallocate(key.storage_);
  }
  h_arr_storage =
       (ObjectItem *)
       (h_arr_var.
        super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
        .hashTable_ +
       ((ulong)h_arr_var.
               super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               ._8_8_ >> 0x20));
  Value<char>::operator=(&value1,&h_arr_var);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Object) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Object;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0x982);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x983);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,(void *)((long)&(value1.field_0.array_.storage_)->field_0 +
                                (ulong)*(uint *)((long)pVVar2 + 0xc) * 4),0x984);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  key.storage_ = (char *)((long)&(value1.field_0.array_.storage_)->field_0 +
                         (ulong)*(uint *)((long)pVVar2 + 0xc) * 4);
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (test,(HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> **)&key,&h_arr_storage,0x985
            );
  Value<char>::Reset(&value1);
  Value<char>::operator=(&value1,0x17);
  String<char>::String(&key,"-ABCDEF0123456789ABCDEF0123456789-");
  String<char>::operator=(&str_var,&key);
  Memory::Deallocate(key.storage_);
  c_str_var = str_var.storage_;
  Value<char>::operator=(&value1,&str_var);
  if (value1.type_ != String) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == String;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0x98f);
  key.storage_ = Value<char>::StringStorage(&value1);
  QTest::IsNotEqual<char_const*,char_const*>(test,&key.storage_,&c_str_var,0x990);
  Value<char>::Reset(&value1);
  Value<char>::operator=(&value1,0x21);
  Array<Qentem::Value<char>_>::Array((Array<Qentem::Value<char>_> *)&key,1,false);
  Array<Qentem::Value<char>_>::operator=(&arr_var,(Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&key);
  Value<char>::operator=(&value1,&arr_var);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0x999);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x99a);
  QTest::IsNull(test,(void *)value1.field_0.number_,0x99b);
  Value<char>::Reset(&value1);
  Value<char>::operator=(&value1,0x21);
  key.storage_ = (char *)0x0;
  key.length_ = 0;
  key._12_4_ = 0;
  Array<Qentem::Value<char>_>::operator=(&arr_var,(Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&key);
  Array<Qentem::Value<char>_>::ResizeAndInitialize(&arr_var,3);
  arr_storage = arr_var.storage_;
  Value<char>::operator=(&value1,&arr_var);
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0x9a4);
  uVar3 = 0;
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x9a5);
  QTest::IsNotNull(test,(void *)value1.field_0.number_,0x9a6);
  key.storage_ = value1.field_0.string_.storage_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,(Value<char> **)&key,&arr_storage,0x9a7);
  Value<char>::Reset(&value1);
  Value<char>::operator=(&value1,0x22);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&key,1);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&h_arr_var.
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ,(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  Value<char>::operator=
            (&value1,(ObjectT *)
                     &h_arr_var.
                      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            );
  if (value1.type_ == Object) {
    bVar4 = true;
  }
  else if (value1.type_ == ValuePtr) {
    bVar4 = (value1.field_0.array_.storage_)->type_ == Object;
  }
  else {
    bVar4 = false;
  }
  QTest::IsTrue(test,bVar4,0x9b0);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x9b1);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNull(test,(void *)((long)&(value1.field_0.array_.storage_)->field_0 +
                             (ulong)*(uint *)((long)pVVar2 + 0xc) * 4),0x9b2);
  Value<char>::Reset(&value1);
  Value<char>::operator=(&value1,0x22);
  key.storage_ = (char *)0x0;
  key.length_ = 0;
  key._12_4_ = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&h_arr_var.
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ,(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&key);
  for (; uVar3 != 3; uVar3 = uVar3 + 1) {
    key.storage_ = (char *)0x0;
    key._8_8_ = key._8_8_ & 0xffffffff00000000;
    Digit::NumberToString<false,Qentem::String<char>,unsigned_int>
              ((String<char> *)&key,uVar3,(RealFormatInfo)0x6);
    pVVar1 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator[]
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)
                        &h_arr_var.
                         super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                        ,(String<char> *)&key);
    Value<char>::operator=(pVVar1,uVar3);
    Memory::Deallocate(key.storage_);
  }
  h_arr_storage =
       (ObjectItem *)
       (h_arr_var.
        super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
        .hashTable_ +
       ((ulong)h_arr_var.
               super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               ._8_8_ >> 0x20));
  Value<char>::operator=(&value1,&h_arr_var);
  if (value1.type_ == Object) {
    bVar4 = true;
  }
  else if (value1.type_ == ValuePtr) {
    bVar4 = (value1.field_0.array_.storage_)->type_ == Object;
  }
  else {
    bVar4 = false;
  }
  QTest::IsTrue(test,bVar4,0x9c2);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x9c3);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,(void *)((long)&(value1.field_0.array_.storage_)->field_0 +
                                (ulong)*(uint *)((long)pVVar2 + 0xc) * 4),0x9c4);
  pVVar2 = (ValueC *)(undefined1 *)0x0;
  if (value1.type_ == Object) {
    pVVar2 = &value1;
  }
  key.storage_ = (char *)((long)&(value1.field_0.array_.storage_)->field_0 +
                         (ulong)*(uint *)((long)pVVar2 + 0xc) * 4);
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (test,(HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> **)&key,&h_arr_storage,0x9c5
            );
  Value<char>::Reset(&value1);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable(&h_arr_var.
              super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            );
  Array<Qentem::Value<char>_>::~Array(&arr_var);
  Memory::Deallocate(str_var.storage_);
  Value<char>::~Value(&value1);
  return;
}

Assistant:

static void TestCopyValue1(QTest &test) {
    ValueC value1;

    // true
    // false
    // null

    VString     str_var;
    const char *c_str_var; // = str_var.First();

    VArray        arr_var;
    const ValueC *arr_storage; // = arr_var.First();

    VHArray           h_arr_var;
    const ObjectItem *h_arr_storage; // = h_arr_var.First();

    ////////////////////////////////////////////

    value1 = true;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = true;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = true;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = true;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = true;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////

    value1 = false;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = false;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = false;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = false;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = false;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////

    value1 = nullptr;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = nullptr;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = nullptr;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = nullptr;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = nullptr;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////

    value1 = 23;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = 33;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = 33;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = 34;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = 34;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////
}